

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int btreeOverwriteCell(BtCursor *pCur,BtreePayload *pX)

{
  ushort uVar1;
  u8 *pDest;
  MemPage *pPage;
  int iVar2;
  uint iAmt;
  undefined8 in_R9;
  
  pDest = (pCur->info).pPayload;
  pPage = pCur->pPage;
  uVar1 = (pCur->info).nLocal;
  if ((pDest + uVar1 <= pPage->aDataEnd) && (pPage->aData + pPage->cellOffset <= pDest)) {
    iAmt = pX->nZero + pX->nData;
    if (iAmt == uVar1) {
      iVar2 = btreeOverwriteContent(pPage,pDest,pX,0,iAmt);
      return iVar2;
    }
    iVar2 = btreeOverwriteOverflowCell(pCur,pX);
    return iVar2;
  }
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x138b9,
              "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70",in_R9,pPage);
  return 0xb;
}

Assistant:

static int btreeOverwriteCell(BtCursor *pCur, const BtreePayload *pX){
  int nTotal = pX->nData + pX->nZero; /* Total bytes of to write */
  MemPage *pPage = pCur->pPage;       /* Page being written */

  if( pCur->info.pPayload + pCur->info.nLocal > pPage->aDataEnd
   || pCur->info.pPayload < pPage->aData + pPage->cellOffset
  ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  if( pCur->info.nLocal==nTotal ){
    /* The entire cell is local */
    return btreeOverwriteContent(pPage, pCur->info.pPayload, pX,
                                 0, pCur->info.nLocal);
  }else{
    /* The cell contains overflow content */
    return btreeOverwriteOverflowCell(pCur, pX);
  }
}